

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.h
# Opt level: O2

void __thiscall llvm::DelimitedScope<'[',_']'>::~DelimitedScope(DelimitedScope<_[_,__]_> *this)

{
  ScopedPrinter *this_00;
  raw_ostream *prVar1;
  int iVar2;
  
  this_00 = this->W;
  iVar2 = 1;
  if (1 < this_00->IndentLevel) {
    iVar2 = this_00->IndentLevel;
  }
  this_00->IndentLevel = iVar2 + -1;
  prVar1 = ScopedPrinter::startLine(this_00);
  prVar1 = raw_ostream::operator<<(prVar1,']');
  raw_ostream::operator<<(prVar1,'\n');
  return;
}

Assistant:

~DelimitedScope() {
    W.unindent();
    W.startLine() << Close << '\n';
  }